

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_with_opts.c
# Opt level: O2

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/icsiii[P]embedded-abstract-message/vendor/cJSON/tests/parse_with_opts.c"
            );
  UnityDefaultTestRun(parse_with_opts_should_handle_null,"parse_with_opts_should_handle_null",0x4c);
  UnityDefaultTestRun(parse_with_opts_should_handle_empty_strings,
                      "parse_with_opts_should_handle_empty_strings",0x4d);
  UnityDefaultTestRun(parse_with_opts_should_require_null_if_requested,
                      "parse_with_opts_should_require_null_if_requested",0x4e);
  UnityDefaultTestRun(parse_with_opts_should_return_parse_end,
                      "parse_with_opts_should_return_parse_end",0x4f);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
    UNITY_BEGIN();

    RUN_TEST(parse_with_opts_should_handle_null);
    RUN_TEST(parse_with_opts_should_handle_empty_strings);
    RUN_TEST(parse_with_opts_should_require_null_if_requested);
    RUN_TEST(parse_with_opts_should_return_parse_end);

    return UNITY_END();
}